

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void random_colors(Model *model,TGAImage *image)

{
  undefined1 auVar1 [36];
  int iVar2;
  int iVar3;
  pointer pdVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  int j;
  size_t i;
  ulong iface;
  int *piVar8;
  array<vec<3UL,_int>,_3UL> pts;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  vec3f local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  pdVar4 = (pointer)operator_new(0x2bf200);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar4 + 360000;
  lVar6 = 0;
  do {
    pdVar4[lVar6] = -1.79769313486232e+308;
    (pdVar4 + lVar6)[1] = -1.79769313486232e+308;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 360000);
  iface = 0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar4;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  while( true ) {
    sVar5 = Model::nfaces(model);
    if (sVar5 <= iface) break;
    local_78 = 0;
    uStack_70 = 0;
    uStack_80 = 0;
    local_68 = 0;
    piVar8 = (int *)&uStack_80;
    sVar5 = 0;
    do {
      Model::vert(&local_60,model,iface,sVar5);
      iVar7 = (int)local_60.z;
      *(ulong *)(piVar8 + -2) =
           CONCAT44((int)((local_60.y + 1.0) * 600.0 * 0.5 + 0.5),
                    (int)((local_60.x + 1.0) * 600.0 * 0.5 + 0.5));
      *piVar8 = iVar7;
      sVar5 = sVar5 + 1;
      piVar8 = piVar8 + 3;
    } while (sVar5 != 3);
    iVar7 = rand();
    iVar2 = rand();
    iVar3 = rand();
    auVar1._8_8_ = local_78;
    auVar1._0_8_ = uStack_80;
    auVar1._16_8_ = uStack_70;
    auVar1._24_4_ = local_68;
    auVar1._28_8_ = 0;
    triangle((array<vec<3UL,_int>,_3UL>)(auVar1 << 0x40),&local_48,image,
             (TGAColor)
             ((uint5)(((uint)((ulong)((long)iVar3 * 0x80808081) >> 0x27) - (iVar3 >> 0x1f)) + iVar3
                      & 0xff | (((uint)((ulong)((long)iVar2 * 0x80808081) >> 0x27) - (iVar2 >> 0x1f)
                                ) + iVar2 & 0xff) << 8 | (iVar7 % 0xff) * 0x10000) | 0x4ff000000));
    iface = iface + 1;
  }
  operator_delete(pdVar4,0x2bf200);
  return;
}

Assistant:

void random_colors(Model &model, TGAImage &image)
{
    vec3f light_dir{0, 0, -1};
    std::vector<double> zbuffer(width * height, -std::numeric_limits<double>::max());
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec3i, 3> pts;
        for (int j = 0; j < 3; j++) pts[j] = world2screen(model.vert(i, j));
        triangle(pts, zbuffer, image, TGAColor(rand() % 255, rand() % 255, rand() % 255, 255));
    }
}